

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# suffixtree.cpp
# Opt level: O1

void __thiscall SuffixTree::GeneralizedSuffixTree::IncActiveLength(GeneralizedSuffixTree *this)

{
  mapped_type *pmVar1;
  
  this->active_length = this->active_length + 1;
  pmVar1 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_SuffixTree::Edge>,_std::allocator<std::pair<const_unsigned_int,_SuffixTree::Edge>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->active_node->edges,&this->active_edge);
  if ((pmVar1->length != 0) && (this->active_length == pmVar1->length)) {
    this->active_node = (Node *)pmVar1->field_0;
    this->active_length = 0;
  }
  return;
}

Assistant:

void GeneralizedSuffixTree::IncActiveLength()
{
	++active_length;
	Edge &edge = active_node->edges[active_edge];
	if (edge.length && active_length == edge.length)
	{
		active_node = edge.node;
		active_length = 0;
	}
}